

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTextureCubeArrayInt
          (GatherBase *this,int slices,int data_slice)

{
  CallLogWrapper *this_00;
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  uint width;
  int i_1;
  allocator_type local_95;
  int local_94;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  Vector<int,_4> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_94 = data_slice;
  iVar1 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0x9009,this->tex);
  iVar2 = slices * 6;
  width = 0x20;
  for (iVar3 = 0; iVar3 != 6; iVar3 = iVar3 + 1) {
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x9009,iVar3,iVar1,width,width,iVar2,0,0x8d99,0x1404,(void *)0x0);
    width = width >> 1;
  }
  tcu::Vector<int,_4>::Vector(&local_78,999);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&pixels,0x400,&local_78,&local_95);
  iVar1 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != iVar1; iVar1 = iVar1 + 1) {
    glu::CallLogWrapper::glTexSubImage3D
              (this_00,0x9009,0,0,0,iVar1,0x20,0x20,1,0x8d99,0x1404,
               pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_78.m_data[0] = 0xc;
  local_78.m_data[1] = 0xd;
  local_78.m_data[2] = 0xe;
  local_78.m_data[3] = 0xf;
  local_68 = 0x900000008;
  uStack_60 = 0xb0000000a;
  local_58 = 0x100000000;
  uStack_50 = 0x300000002;
  local_48 = 0x500000004;
  uStack_40 = 0x700000006;
  iVar1 = local_94 * 6;
  for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 1) {
    iVar3 = iVar2 + iVar1;
    glu::CallLogWrapper::glTexSubImage3D
              (this_00,0x9009,0,0x16,0x19,iVar3,2,2,1,0x8d99,0x1404,&local_78);
    glu::CallLogWrapper::glTexSubImage3D(this_00,0x9009,0,9,0xe,iVar3,1,1,1,0x8d99,0x1404,&local_48)
    ;
    glu::CallLogWrapper::glTexSubImage3D
              (this_00,0x9009,0,0x10,10,iVar3,1,1,1,0x8d99,0x1404,&local_78);
    glu::CallLogWrapper::glTexSubImage3D(this_00,0x9009,0,0xb,2,iVar3,1,1,1,0x8d99,0x1404,&local_68)
    ;
    glu::CallLogWrapper::glTexSubImage3D
              (this_00,0x9009,0,0x18,0xd,iVar3,1,1,1,0x8d99,0x1404,&local_58);
  }
  glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2800,0x2600);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>)
  ;
  return;
}

Assistant:

virtual GLvoid CreateTextureCubeArrayInt(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= GL_RGBA_INTEGER;
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, i, internal_format, size, size, 6 * slices, 0, format, GL_INT, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		for (int j = 0; j < 6 * slices; ++j)
		{
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 0, 0, j, csize, csize, 1, format, GL_INT, &pixels[0]);
		}

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		for (int i = 0; i < 6; ++i)
		{
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 22, 25, (6 * data_slice) + i, 2, 2, 1, format, GL_INT, data);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 9, 14, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 3);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 16, 10, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 0);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 11, 2, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 1);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 24, 13, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 2);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}